

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

void xmlBufFree(xmlBufPtr buf)

{
  xmlBufPtr buf_local;
  
  if (buf != (xmlBufPtr)0x0) {
    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != (xmlChar *)0x0)) {
      (*xmlFree)(buf->contentIO);
    }
    else if ((buf->content != (xmlChar *)0x0) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
      (*xmlFree)(buf->content);
    }
    (*xmlFree)(buf);
  }
  return;
}

Assistant:

void
xmlBufFree(xmlBufPtr buf) {
    if (buf == NULL) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufFree: buf == NULL\n");
#endif
	return;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
        (buf->contentIO != NULL)) {
        xmlFree(buf->contentIO);
    } else if ((buf->content != NULL) &&
        (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
        xmlFree(buf->content);
    }
    xmlFree(buf);
}